

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::FileDescriptorTables::FindFieldByNumber
          (FileDescriptorTables *this,Descriptor *parent,int number)

{
  FieldsByNumberSet *common;
  size_t *psVar1;
  ctrl_t *pcVar2;
  undefined1 (*pauVar3) [16];
  undefined1 auVar4 [16];
  bool bVar5;
  uint32_t uVar6;
  FieldDescriptor *pFVar7;
  undefined1 (*pauVar8) [16];
  size_t sVar9;
  ctrl_t *pcVar10;
  size_t *psVar11;
  slot_type *ppFVar12;
  reference ppFVar13;
  slot_type *slot;
  slot_type *slot_00;
  slot_type *slot_01;
  ulong extraout_RDX;
  ulong uVar14;
  ushort uVar15;
  undefined4 uVar16;
  undefined1 auVar17 [16];
  __m128i match;
  ctrl_t cVar18;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  ctrl_t cVar33;
  ctrl_t cVar34;
  undefined1 auVar19 [16];
  const_iterator it;
  size_t hash_of_arg;
  anon_class_24_3_2b146c49 local_a8;
  Descriptor *local_88;
  int local_80;
  GroupPortableImpl local_78;
  anon_class_24_3_2b146c49 local_70;
  undefined8 local_58;
  ctrl_t cStack_50;
  ctrl_t cStack_4f;
  ctrl_t cStack_4e;
  ctrl_t cStack_4d;
  ctrl_t cStack_4c;
  ctrl_t cStack_4b;
  ctrl_t cStack_4a;
  ctrl_t cStack_49;
  undefined1 local_48 [16];
  size_t local_38;
  
  if ((0 < number && parent != (Descriptor *)0x0) &&
     ((uint)number <= (uint)parent->sequential_field_limit_)) {
    pFVar7 = Descriptor::field(parent,number + -1);
    return pFVar7;
  }
  common = &this->fields_by_number_;
  local_88 = parent;
  local_80 = number;
  bVar5 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::empty(&common->
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  if (!bVar5) {
    local_38 = (anonymous_namespace)::ParentNumberHash::operator()
                         ((ParentNumberHash *)&local_88,(ParentNumberQuery *)parent);
    local_70.hash_of_arg = &local_38;
    local_70.key = (ParentNumberQuery *)&local_88;
    local_70.this =
         &common->
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ;
    bVar5 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::is_soo(&common->
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    );
    if (bVar5) {
      parent = (Descriptor *)
               absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::soo_slot(&common->
                           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         );
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::AssertHashEqConsistent<google::protobuf::(anonymous_namespace)::ParentNumberQuery>::
      anon_class_24_3_2b146c49::operator()(&local_70,(ctrl_t *)parent,slot);
    }
    else {
      sVar9 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::capacity(&common->
                          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        );
      if (sVar9 < 0x11) {
        ppFVar12 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::slot_array(&common->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               );
        local_a8.hash_of_arg = local_70.hash_of_arg;
        local_a8.this = local_70.this;
        local_a8.key = local_70.key;
        uVar14 = (this->fields_by_number_).
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 .settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        pauVar3 = (undefined1 (*) [16])
                  (this->fields_by_number_).
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  .settings_.
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.heap_or_soo_.heap.control;
        if (uVar14 < 0xf) {
          if (8 < uVar14) {
            __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x78b,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FieldDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
          local_78.ctrl = *(uint64_t *)(*pauVar3 + uVar14);
          for (local_78.ctrl =
                    (uint64_t)
                    absl::lts_20250127::container_internal::GroupPortableImpl::MaskFull(&local_78);
              local_78.ctrl != 0; local_78.ctrl = local_78.ctrl - 1 & local_78.ctrl) {
            uVar6 = absl::lts_20250127::container_internal::NonIterableBitMask<unsigned_long,_8,_3>
                    ::LowestBitSet((NonIterableBitMask<unsigned_long,_8,_3> *)&local_78);
            parent = (Descriptor *)(ppFVar12 + ((ulong)uVar6 - 1));
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::AssertHashEqConsistent<google::protobuf::(anonymous_namespace)::ParentNumberQuery>::
            anon_class_24_3_2b146c49::operator()(&local_a8,(ctrl_t *)parent,slot_00);
          }
        }
        else {
          local_48._0_8_ = this;
          uVar14 = (this->fields_by_number_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.size_ >> 1;
          local_58 = uVar14;
          while (pauVar8 = pauVar3, uVar14 != 0) {
            auVar17 = *pauVar8;
            for (uVar15 = ~((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar17[0xf] >> 7) << 0xf); uVar15 != 0;
                uVar15 = uVar15 - 1 & uVar15) {
              uVar6 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(uVar15);
              if ((char)(*pauVar8)[uVar6] < '\0') {
                __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x79d,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FieldDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                             );
              }
              parent = (Descriptor *)(ppFVar12 + uVar6);
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::AssertHashEqConsistent<google::protobuf::(anonymous_namespace)::ParentNumberQuery>::
              anon_class_24_3_2b146c49::operator()(&local_a8,(ctrl_t *)parent,slot_01);
              uVar14 = uVar14 - 1;
            }
            ppFVar12 = ppFVar12 + 0x10;
            pauVar3 = pauVar8 + 1;
            if ((uVar14 != 0) && ((*pauVar8)[0xf] == -1)) {
              __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7a5,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FieldDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                           );
            }
          }
          if (local_58 < *(ulong *)(local_48._0_8_ + 0x40) >> 1) {
            __assert_fail("(original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7aa,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FieldDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
        }
      }
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&common->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            );
  bVar5 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::is_soo(&common->
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  );
  if (bVar5) {
    bVar5 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::is_soo(&common->
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    );
    if (!bVar5) {
      __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe21,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>, K = google::protobuf::(anonymous namespace)::ParentNumberQuery]"
                   );
    }
    bVar5 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::empty(&common->
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   );
    if (!bVar5) {
      ppFVar12 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::soo_slot(&common->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           );
      if (((*ppFVar12)->containing_type_ == local_88) && ((*ppFVar12)->number_ == local_80)) {
        local_a8._0_16_ =
             absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::soo_iterator(&common->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           );
        goto LAB_00150607;
      }
    }
  }
  else {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::prefetch_heap_block
              (&common->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              );
    sVar9 = (anonymous_namespace)::ParentNumberHash::operator()
                      ((ParentNumberHash *)&local_88,(ParentNumberQuery *)parent);
    bVar5 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::is_soo(&common->
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    );
    if (bVar5) {
      __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe2a,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>, K = google::protobuf::(anonymous namespace)::ParentNumberQuery]"
                   );
    }
    absl::lts_20250127::container_internal::probe
              ((probe_seq<16UL> *)&local_a8,(CommonFields *)common,sVar9);
    pcVar10 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::control(&common->
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       );
    auVar17 = ZEXT216(CONCAT11((char)sVar9,(char)sVar9) & 0x7f7f);
    auVar17 = pshuflw(auVar17,auVar17,0);
    uVar16 = auVar17._0_4_;
    local_48._4_4_ = uVar16;
    local_48._0_4_ = uVar16;
    local_48._8_4_ = uVar16;
    local_48._12_4_ = uVar16;
    while( true ) {
      pcVar2 = pcVar10 + (long)local_a8.this;
      auVar17[0] = -(local_48[0] == *pcVar2);
      auVar17[1] = -(local_48[1] == pcVar2[1]);
      auVar17[2] = -(local_48[2] == pcVar2[2]);
      auVar17[3] = -(local_48[3] == pcVar2[3]);
      auVar17[4] = -(local_48[4] == pcVar2[4]);
      auVar17[5] = -(local_48[5] == pcVar2[5]);
      auVar17[6] = -(local_48[6] == pcVar2[6]);
      auVar17[7] = -(local_48[7] == pcVar2[7]);
      auVar17[8] = -(local_48[8] == pcVar2[8]);
      auVar17[9] = -(local_48[9] == pcVar2[9]);
      auVar17[10] = -(local_48[10] == pcVar2[10]);
      auVar17[0xb] = -(local_48[0xb] == pcVar2[0xb]);
      auVar17[0xc] = -(local_48[0xc] == pcVar2[0xc]);
      auVar17[0xd] = -(local_48[0xd] == pcVar2[0xd]);
      auVar17[0xe] = -(local_48[0xe] == pcVar2[0xe]);
      auVar17[0xf] = -(local_48[0xf] == pcVar2[0xf]);
      cVar18 = *pcVar2;
      cVar20 = pcVar2[1];
      cVar21 = pcVar2[2];
      cVar22 = pcVar2[3];
      cVar23 = pcVar2[4];
      cVar24 = pcVar2[5];
      cVar25 = pcVar2[6];
      cVar26 = pcVar2[7];
      cVar27 = pcVar2[8];
      cVar28 = pcVar2[9];
      cVar29 = pcVar2[10];
      cVar30 = pcVar2[0xb];
      cVar31 = pcVar2[0xc];
      cVar32 = pcVar2[0xd];
      cVar33 = pcVar2[0xe];
      cVar34 = pcVar2[0xf];
      for (uVar15 = (ushort)(SUB161(auVar17 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar17[0xf] >> 7) << 0xf; uVar15 != 0; uVar15 = uVar15 - 1 & uVar15) {
        local_58 = CONCAT17(cVar26,CONCAT16(cVar25,CONCAT15(cVar24,CONCAT14(cVar23,CONCAT13(cVar22,
                                                  CONCAT12(cVar21,CONCAT11(cVar20,cVar18)))))));
        cStack_50 = cVar27;
        cStack_4f = cVar28;
        cStack_4e = cVar29;
        cStack_4d = cVar30;
        cStack_4c = cVar31;
        cStack_4b = cVar32;
        cStack_4a = cVar33;
        cStack_49 = cVar34;
        uVar6 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(uVar15);
        ppFVar12 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::slot_array(&common->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               );
        uVar14 = (long)local_a8.this + (ulong)uVar6 & (ulong)local_a8.key;
        if ((ppFVar12[uVar14]->containing_type_ == local_88) &&
           (ppFVar12[uVar14]->number_ == local_80)) {
          local_a8._0_16_ =
               absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::iterator_at(&common->
                              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ,uVar14);
          goto LAB_00150607;
        }
        cVar18 = (ctrl_t)local_58;
        cVar20 = local_58._1_1_;
        cVar21 = local_58._2_1_;
        cVar22 = local_58._3_1_;
        cVar23 = local_58._4_1_;
        cVar24 = local_58._5_1_;
        cVar25 = local_58._6_1_;
        cVar26 = local_58._7_1_;
        cVar27 = cStack_50;
        cVar28 = cStack_4f;
        cVar29 = cStack_4e;
        cVar30 = cStack_4d;
        cVar31 = cStack_4c;
        cVar32 = cStack_4b;
        cVar33 = cStack_4a;
        cVar34 = cStack_49;
      }
      auVar19[0] = -(cVar18 == kEmpty);
      auVar19[1] = -(cVar20 == kEmpty);
      auVar19[2] = -(cVar21 == kEmpty);
      auVar19[3] = -(cVar22 == kEmpty);
      auVar19[4] = -(cVar23 == kEmpty);
      auVar19[5] = -(cVar24 == kEmpty);
      auVar19[6] = -(cVar25 == kEmpty);
      auVar19[7] = -(cVar26 == kEmpty);
      auVar19[8] = -(cVar27 == kEmpty);
      auVar19[9] = -(cVar28 == kEmpty);
      auVar19[10] = -(cVar29 == kEmpty);
      auVar19[0xb] = -(cVar30 == kEmpty);
      auVar19[0xc] = -(cVar31 == kEmpty);
      auVar19[0xd] = -(cVar32 == kEmpty);
      auVar19[0xe] = -(cVar33 == kEmpty);
      auVar19[0xf] = -(cVar34 == kEmpty);
      if ((((((((((((((((auVar19 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar19 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar19 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar19 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar19 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar19 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar19 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar19 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar19 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar19 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar19 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar19 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar34 == kEmpty)
      break;
      psVar1 = local_a8.hash_of_arg + 2;
      local_a8.this =
           (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)((long)local_a8.hash_of_arg + (long)local_a8.this + 0x10U & (ulong)local_a8.key);
      local_a8.hash_of_arg = psVar1;
      psVar11 = (size_t *)
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::capacity(&common->
                            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          );
      if (psVar11 < psVar1) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe37,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>, K = google::protobuf::(anonymous namespace)::ParentNumberQuery]"
                     );
      }
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&common->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            );
  auVar4._8_8_ = 0;
  auVar4._0_8_ = extraout_RDX;
  local_a8._0_16_ = auVar4 << 0x40;
LAB_00150607:
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&common->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            );
  local_70.key = (ParentNumberQuery *)0x0;
  bVar5 = absl::lts_20250127::container_internal::operator==
                    ((const_iterator *)&local_a8,(const_iterator *)&local_70);
  if (bVar5) {
    pFVar7 = (FieldDescriptor *)0x0;
  }
  else {
    ppFVar13 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::iterator::operator*((iterator *)&local_a8);
    pFVar7 = *ppFVar13;
  }
  return pFVar7;
}

Assistant:

inline const FieldDescriptor* FileDescriptorTables::FindFieldByNumber(
    const Descriptor* parent, int number) const {
  // If `number` is within the sequential range, just index into the parent
  // without doing a table lookup.
  if (parent != nullptr &&  //
      1 <= number && number <= parent->sequential_field_limit_) {
    return parent->field(number - 1);
  }

  auto it = fields_by_number_.find(ParentNumberQuery{{parent, number}});
  return it == fields_by_number_.end() ? nullptr : *it;
}